

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O1

ms * __thiscall llvm::APInt::magic(ms *__return_storage_ptr__,APInt *this)

{
  APInt *this_00;
  ms *this_01;
  bool bVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  APInt R;
  APInt q2;
  APInt q1;
  APInt r2;
  APInt r1;
  APInt ad;
  APInt t;
  APInt anc;
  APInt signedMin;
  APInt delta;
  anon_union_8_2_1313ab2f_for_U local_188;
  uint local_180;
  anon_union_8_2_1313ab2f_for_U local_178;
  uint local_170;
  anon_union_8_2_1313ab2f_for_U local_168;
  uint local_160;
  anon_union_8_2_1313ab2f_for_U local_158;
  uint local_150;
  anon_union_8_2_1313ab2f_for_U local_148;
  uint local_140;
  anon_union_8_2_1313ab2f_for_U local_138;
  uint local_130;
  anon_union_8_2_1313ab2f_for_U local_128;
  uint local_120;
  uint local_114;
  anon_union_8_2_1313ab2f_for_U local_110;
  uint local_108;
  anon_union_8_2_1313ab2f_for_U local_100;
  uint local_f8;
  anon_union_8_2_1313ab2f_for_U local_f0;
  uint local_e8;
  anon_union_8_2_1313ab2f_for_U local_e0;
  uint local_d8;
  anon_union_8_2_1313ab2f_for_U local_d0;
  uint local_c8;
  anon_union_8_2_1313ab2f_for_U local_c0;
  uint local_b8;
  anon_union_8_2_1313ab2f_for_U local_b0;
  uint local_a8;
  anon_union_8_2_1313ab2f_for_U local_a0;
  uint local_98;
  APInt *local_90;
  ms *local_88;
  anon_union_8_2_1313ab2f_for_U local_80;
  uint local_78;
  anon_union_8_2_1313ab2f_for_U local_70;
  uint local_68;
  anon_union_8_2_1313ab2f_for_U local_60;
  uint local_58;
  anon_union_8_2_1313ab2f_for_U local_50;
  uint local_48;
  anon_union_8_2_1313ab2f_for_U local_40;
  uint local_38;
  
  local_120 = 1;
  local_128.VAL = 0;
  local_a8 = 1;
  local_b0.VAL = 0;
  local_48 = 1;
  local_50.VAL = 0;
  local_150 = 1;
  local_158.VAL = 0;
  local_130 = 1;
  local_138.VAL = 0;
  local_170 = 1;
  local_178.VAL = 0;
  local_140 = 1;
  local_148.VAL = 0;
  local_b8 = 1;
  local_c0.VAL = 0;
  uVar3 = this->BitWidth;
  APInt((APInt *)&local_a0,uVar3,0,false);
  setBit((APInt *)&local_a0,uVar3 - 1);
  (__return_storage_ptr__->m).BitWidth = 1;
  (__return_storage_ptr__->m).U.VAL = 0;
  local_88 = __return_storage_ptr__;
  abs((APInt *)&local_188,(int)this);
  operator=((APInt *)&local_128,(APInt *)&local_188);
  if ((0x40 < local_180) && ((void *)local_188.VAL != (void *)0x0)) {
    operator_delete__(local_188.pVal);
  }
  local_160 = this->BitWidth;
  uVar3 = local_160 - 1;
  if ((ulong)local_160 < 0x41) {
    local_168 = this->U;
  }
  else {
    uVar4 = (ulong)((uint)((ulong)local_160 + 0x3f >> 3) & 0xfffffff8);
    local_168.pVal = (uint64_t *)operator_new__(uVar4);
    memcpy(local_168.pVal,(this->U).pVal,uVar4);
  }
  lshrInPlace((APInt *)&local_168,uVar3);
  operator+=((APInt *)&local_168,(APInt *)&local_a0);
  local_180 = local_160;
  local_188.VAL = local_168.VAL;
  local_160 = 0;
  operator=((APInt *)&local_c0,(APInt *)&local_188);
  if ((0x40 < local_180) && (local_188.VAL != 0)) {
    operator_delete__(local_188.pVal);
  }
  if ((0x40 < local_160) && (local_168.VAL != 0)) {
    operator_delete__(local_168.pVal);
  }
  local_58 = local_b8;
  if ((ulong)local_b8 < 0x41) {
    local_60.VAL = local_c0.VAL;
  }
  else {
    uVar4 = (ulong)((uint)((ulong)local_b8 + 0x3f >> 3) & 0xfffffff8);
    local_60.pVal = (uint64_t *)operator_new__(uVar4);
    memcpy(local_60.pVal,local_c0.pVal,uVar4);
  }
  operator-=((APInt *)&local_60,1);
  uVar3 = local_58;
  local_160 = local_58;
  local_168.VAL = local_60.VAL;
  local_58 = 0;
  urem((APInt *)&local_40,(APInt *)&local_c0);
  flipAllBits((APInt *)&local_40);
  operator++((APInt *)&local_40);
  operator+=((APInt *)&local_40,(APInt *)&local_168);
  local_180 = local_38;
  local_188.VAL = local_40.VAL;
  local_38 = 0;
  operator=((APInt *)&local_b0,(APInt *)&local_188);
  if ((0x40 < local_180) && ((void *)local_188.VAL != (void *)0x0)) {
    operator_delete__(local_188.pVal);
  }
  if ((0x40 < local_38) && ((uint64_t *)local_40.VAL != (uint64_t *)0x0)) {
    operator_delete__(local_40.pVal);
  }
  if ((0x40 < uVar3) && ((uint64_t *)local_168.VAL != (uint64_t *)0x0)) {
    operator_delete__(local_168.pVal);
  }
  if ((0x40 < local_58) && ((uint64_t *)local_60.VAL != (uint64_t *)0x0)) {
    operator_delete__(local_60.pVal);
  }
  local_114 = this->BitWidth;
  udiv((APInt *)&local_188,(APInt *)&local_a0);
  operator=((APInt *)&local_158,(APInt *)&local_188);
  if ((0x40 < local_180) && ((void *)local_188.VAL != (void *)0x0)) {
    operator_delete__(local_188.pVal);
  }
  operator*((APInt *)&local_168,(APInt *)&local_158);
  flipAllBits((APInt *)&local_168);
  operator++((APInt *)&local_168);
  operator+=((APInt *)&local_168,(APInt *)&local_a0);
  local_180 = local_160;
  local_188.VAL = local_168.VAL;
  local_160 = 0;
  operator=((APInt *)&local_138,(APInt *)&local_188);
  if ((0x40 < local_180) && ((void *)local_188.VAL != (void *)0x0)) {
    operator_delete__(local_188.pVal);
  }
  if ((0x40 < local_160) && ((uint64_t *)local_168.VAL != (uint64_t *)0x0)) {
    operator_delete__(local_168.pVal);
  }
  udiv((APInt *)&local_188,(APInt *)&local_a0);
  operator=((APInt *)&local_178,(APInt *)&local_188);
  if ((0x40 < local_180) && ((void *)local_188.VAL != (void *)0x0)) {
    operator_delete__(local_188.pVal);
  }
  operator*((APInt *)&local_168,(APInt *)&local_178);
  flipAllBits((APInt *)&local_168);
  operator++((APInt *)&local_168);
  operator+=((APInt *)&local_168,(APInt *)&local_a0);
  local_180 = local_160;
  local_188.VAL = local_168.VAL;
  local_160 = 0;
  operator=((APInt *)&local_148,(APInt *)&local_188);
  if ((0x40 < local_180) && ((uint64_t *)local_188.VAL != (uint64_t *)0x0)) {
    operator_delete__(local_188.pVal);
  }
  local_90 = this;
  if ((0x40 < local_160) && ((uint64_t *)local_168.VAL != (uint64_t *)0x0)) {
    operator_delete__(local_168.pVal);
  }
  do {
    local_180 = local_150;
    if ((ulong)local_150 < 0x41) {
      local_188.VAL = local_158.VAL;
    }
    else {
      uVar4 = (ulong)((uint)((ulong)local_150 + 0x3f >> 3) & 0xfffffff8);
      local_188.pVal = (uint64_t *)operator_new__(uVar4);
      memcpy(local_188.pVal,local_158.pVal,uVar4);
    }
    operator<<=((APInt *)&local_188,1);
    operator=((APInt *)&local_158,(APInt *)&local_188);
    if ((0x40 < local_180) && ((void *)local_188.VAL != (void *)0x0)) {
      operator_delete__(local_188.pVal);
    }
    local_180 = local_130;
    if ((ulong)local_130 < 0x41) {
      local_188.VAL = local_138.VAL;
    }
    else {
      uVar4 = (ulong)((uint)((ulong)local_130 + 0x3f >> 3) & 0xfffffff8);
      local_188.pVal = (uint64_t *)operator_new__(uVar4);
      memcpy(local_188.pVal,local_138.pVal,uVar4);
    }
    operator<<=((APInt *)&local_188,1);
    operator=((APInt *)&local_138,(APInt *)&local_188);
    if ((0x40 < local_180) && ((void *)local_188.VAL != (void *)0x0)) {
      operator_delete__(local_188.pVal);
    }
    iVar2 = compare((APInt *)&local_138,(APInt *)&local_b0);
    if (-1 < iVar2) {
      local_c8 = local_150;
      if ((ulong)local_150 < 0x41) {
        local_d0.VAL = local_158.VAL;
      }
      else {
        uVar4 = (ulong)((uint)((ulong)local_150 + 0x3f >> 3) & 0xfffffff8);
        local_d0.pVal = (uint64_t *)operator_new__(uVar4);
        memcpy(local_d0.pVal,local_158.pVal,uVar4);
      }
      operator+=((APInt *)&local_d0,1);
      local_180 = local_c8;
      local_188.VAL = local_d0.VAL;
      local_c8 = 0;
      operator=((APInt *)&local_158,(APInt *)&local_188);
      if ((0x40 < local_180) && ((uint64_t *)local_188.VAL != (uint64_t *)0x0)) {
        operator_delete__(local_188.pVal);
      }
      if ((0x40 < local_c8) && ((uint64_t *)local_d0.VAL != (uint64_t *)0x0)) {
        operator_delete__(local_d0.pVal);
      }
      local_d8 = local_130;
      if ((ulong)local_130 < 0x41) {
        local_e0.VAL = local_138.VAL;
      }
      else {
        uVar4 = (ulong)((uint)((ulong)local_130 + 0x3f >> 3) & 0xfffffff8);
        local_e0.pVal = (uint64_t *)operator_new__(uVar4);
        memcpy(local_e0.pVal,local_138.pVal,uVar4);
      }
      operator-=((APInt *)&local_e0,(APInt *)&local_b0);
      local_180 = local_d8;
      local_188.VAL = local_e0.VAL;
      local_d8 = 0;
      operator=((APInt *)&local_138,(APInt *)&local_188);
      if ((0x40 < local_180) && ((void *)local_188.VAL != (void *)0x0)) {
        operator_delete__(local_188.pVal);
      }
      if ((0x40 < local_d8) && ((uint64_t *)local_e0.VAL != (uint64_t *)0x0)) {
        operator_delete__(local_e0.pVal);
      }
    }
    local_180 = local_170;
    if ((ulong)local_170 < 0x41) {
      local_188.VAL = local_178.VAL;
    }
    else {
      uVar4 = (ulong)((uint)((ulong)local_170 + 0x3f >> 3) & 0xfffffff8);
      local_188.pVal = (uint64_t *)operator_new__(uVar4);
      memcpy(local_188.pVal,local_178.pVal,uVar4);
    }
    operator<<=((APInt *)&local_188,1);
    operator=((APInt *)&local_178,(APInt *)&local_188);
    if ((0x40 < local_180) && ((uint64_t *)local_188.VAL != (uint64_t *)0x0)) {
      operator_delete__(local_188.pVal);
    }
    local_180 = local_140;
    if ((ulong)local_140 < 0x41) {
      local_188.VAL = local_148.VAL;
    }
    else {
      uVar4 = (ulong)((uint)((ulong)local_140 + 0x3f >> 3) & 0xfffffff8);
      local_188.pVal = (uint64_t *)operator_new__(uVar4);
      memcpy(local_188.pVal,local_148.pVal,uVar4);
    }
    operator<<=((APInt *)&local_188,1);
    operator=((APInt *)&local_148,(APInt *)&local_188);
    if ((0x40 < local_180) && ((void *)local_188.VAL != (void *)0x0)) {
      operator_delete__(local_188.pVal);
    }
    iVar2 = compare((APInt *)&local_148,(APInt *)&local_128);
    if (-1 < iVar2) {
      local_e8 = local_170;
      if ((ulong)local_170 < 0x41) {
        local_f0.VAL = local_178.VAL;
      }
      else {
        uVar4 = (ulong)((uint)((ulong)local_170 + 0x3f >> 3) & 0xfffffff8);
        local_f0.pVal = (uint64_t *)operator_new__(uVar4);
        memcpy(local_f0.pVal,local_178.pVal,uVar4);
      }
      operator+=((APInt *)&local_f0,1);
      local_180 = local_e8;
      local_188.VAL = local_f0.VAL;
      local_e8 = 0;
      operator=((APInt *)&local_178,(APInt *)&local_188);
      if ((0x40 < local_180) && ((uint64_t *)local_188.VAL != (uint64_t *)0x0)) {
        operator_delete__(local_188.pVal);
      }
      if ((0x40 < local_e8) && ((uint64_t *)local_f0.VAL != (uint64_t *)0x0)) {
        operator_delete__(local_f0.pVal);
      }
      local_f8 = local_140;
      if ((ulong)local_140 < 0x41) {
        local_100.VAL = local_148.VAL;
      }
      else {
        uVar4 = (ulong)((uint)((ulong)local_140 + 0x3f >> 3) & 0xfffffff8);
        local_100.pVal = (uint64_t *)operator_new__(uVar4);
        memcpy(local_100.pVal,local_148.pVal,uVar4);
      }
      operator-=((APInt *)&local_100,(APInt *)&local_128);
      local_180 = local_f8;
      local_188.VAL = local_100.VAL;
      local_f8 = 0;
      operator=((APInt *)&local_148,(APInt *)&local_188);
      if ((0x40 < local_180) && ((void *)local_188.VAL != (void *)0x0)) {
        operator_delete__(local_188.pVal);
      }
      if ((0x40 < local_f8) && ((uint64_t *)local_100.VAL != (uint64_t *)0x0)) {
        operator_delete__(local_100.pVal);
      }
    }
    local_108 = local_120;
    if ((ulong)local_120 < 0x41) {
      local_110.VAL = local_128.VAL;
    }
    else {
      uVar4 = (ulong)((uint)((ulong)local_120 + 0x3f >> 3) & 0xfffffff8);
      local_110.pVal = (uint64_t *)operator_new__(uVar4);
      memcpy(local_110.pVal,local_128.pVal,uVar4);
    }
    operator-=((APInt *)&local_110,(APInt *)&local_148);
    local_180 = local_108;
    local_188.VAL = local_110.VAL;
    local_108 = 0;
    operator=((APInt *)&local_50,(APInt *)&local_188);
    if ((0x40 < local_180) && ((uint64_t *)local_188.VAL != (uint64_t *)0x0)) {
      operator_delete__(local_188.pVal);
    }
    if ((0x40 < local_108) && ((uint64_t *)local_110.VAL != (uint64_t *)0x0)) {
      operator_delete__(local_110.pVal);
    }
    iVar2 = compare((APInt *)&local_158,(APInt *)&local_50);
    if (-1 < iVar2) {
      bVar1 = operator==((APInt *)&local_158,(APInt *)&local_50);
      if (!bVar1) {
LAB_0014798b:
        local_68 = local_170;
        if ((ulong)local_170 < 0x41) {
          local_70.VAL = local_178.VAL;
        }
        else {
          uVar4 = (ulong)((uint)((ulong)local_170 + 0x3f >> 3) & 0xfffffff8);
          local_70.pVal = (uint64_t *)operator_new__(uVar4);
          memcpy(local_70.pVal,local_178.pVal,uVar4);
        }
        this_01 = local_88;
        this_00 = local_90;
        operator+=((APInt *)&local_70,1);
        local_180 = local_68;
        local_188.VAL = local_70.VAL;
        local_68 = 0;
        operator=(&this_01->m,(APInt *)&local_188);
        if ((0x40 < local_180) && (local_188.VAL != 0)) {
          operator_delete__(local_188.pVal);
        }
        if ((0x40 < local_68) && ((uint64_t *)local_70.VAL != (uint64_t *)0x0)) {
          operator_delete__(local_70.pVal);
        }
        bVar1 = operator[](this_00,this_00->BitWidth - 1);
        if (bVar1) {
          local_78 = (this_01->m).BitWidth;
          if ((ulong)local_78 < 0x41) {
            local_80.pVal = *(uint64_t **)&(this_01->m).U;
          }
          else {
            uVar4 = (ulong)((uint)((ulong)local_78 + 0x3f >> 3) & 0xfffffff8);
            local_80.pVal = (uint64_t *)operator_new__(uVar4);
            memcpy(local_80.pVal,(this_01->m).U.pVal,uVar4);
          }
          flipAllBits((APInt *)&local_80);
          operator++((APInt *)&local_80);
          local_180 = local_78;
          local_188.VAL = local_80.VAL;
          local_78 = 0;
          operator=(&this_01->m,(APInt *)&local_188);
          if ((0x40 < local_180) && (local_188.VAL != 0)) {
            operator_delete__(local_188.pVal);
          }
          if ((0x40 < local_78) && (local_80.VAL != 0)) {
            operator_delete__(local_80.pVal);
          }
        }
        this_01->s = local_114 - this_00->BitWidth;
        if ((0x40 < local_98) && ((void *)local_a0.VAL != (void *)0x0)) {
          operator_delete__(local_a0.pVal);
        }
        if ((0x40 < local_b8) && ((uint64_t *)local_c0.VAL != (uint64_t *)0x0)) {
          operator_delete__(local_c0.pVal);
        }
        if ((0x40 < local_140) && ((uint64_t *)local_148.VAL != (uint64_t *)0x0)) {
          operator_delete__(local_148.pVal);
        }
        if ((0x40 < local_170) && ((uint64_t *)local_178.VAL != (uint64_t *)0x0)) {
          operator_delete__(local_178.pVal);
        }
        if ((0x40 < local_130) && ((uint64_t *)local_138.VAL != (uint64_t *)0x0)) {
          operator_delete__(local_138.pVal);
        }
        if ((0x40 < local_150) && ((uint64_t *)local_158.VAL != (uint64_t *)0x0)) {
          operator_delete__(local_158.pVal);
        }
        if ((0x40 < local_48) && ((void *)local_50.VAL != (void *)0x0)) {
          operator_delete__(local_50.pVal);
        }
        if ((0x40 < local_a8) && ((void *)local_b0.VAL != (void *)0x0)) {
          operator_delete__(local_b0.pVal);
        }
        if ((0x40 < local_120) && ((uint64_t *)local_128.VAL != (uint64_t *)0x0)) {
          operator_delete__(local_128.pVal);
        }
        return this_01;
      }
      bVar1 = operator==((APInt *)&local_138,0);
      if (!bVar1) goto LAB_0014798b;
    }
    local_114 = local_114 + 1;
  } while( true );
}

Assistant:

APInt::ms APInt::magic() const {
  const APInt& d = *this;
  unsigned p;
  APInt ad, anc, delta, q1, r1, q2, r2, t;
  APInt signedMin = APInt::getSignedMinValue(d.getBitWidth());
  struct ms mag;

  ad = d.abs();
  t = signedMin + (d.lshr(d.getBitWidth() - 1));
  anc = t - 1 - t.urem(ad);   // absolute value of nc
  p = d.getBitWidth() - 1;    // initialize p
  q1 = signedMin.udiv(anc);   // initialize q1 = 2p/abs(nc)
  r1 = signedMin - q1*anc;    // initialize r1 = rem(2p,abs(nc))
  q2 = signedMin.udiv(ad);    // initialize q2 = 2p/abs(d)
  r2 = signedMin - q2*ad;     // initialize r2 = rem(2p,abs(d))
  do {
    p = p + 1;
    q1 = q1<<1;          // update q1 = 2p/abs(nc)
    r1 = r1<<1;          // update r1 = rem(2p/abs(nc))
    if (r1.uge(anc)) {  // must be unsigned comparison
      q1 = q1 + 1;
      r1 = r1 - anc;
    }
    q2 = q2<<1;          // update q2 = 2p/abs(d)
    r2 = r2<<1;          // update r2 = rem(2p/abs(d))
    if (r2.uge(ad)) {   // must be unsigned comparison
      q2 = q2 + 1;
      r2 = r2 - ad;
    }
    delta = ad - r2;
  } while (q1.ult(delta) || (q1 == delta && r1 == 0));

  mag.m = q2 + 1;
  if (d.isNegative()) mag.m = -mag.m;   // resulting magic number
  mag.s = p - d.getBitWidth();          // resulting shift
  return mag;
}